

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::InvokeWith
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args)

{
  Result RVar1;
  UntypedActionResultHolderBase *f;
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_> holder;
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_> local_10;
  
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args);
  local_10.ptr_ =
       DownCast_<testing::internal::ActionResultHolder<unsigned_char>*,testing::internal::UntypedActionResultHolderBase>
                 (f);
  RVar1 = ((local_10.ptr_)->result_).value_;
  scoped_ptr<testing::internal::ActionResultHolder<unsigned_char>_>::~scoped_ptr(&local_10);
  return RVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }